

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void CLI::detail::remove_default_flag_values(string *flags)

{
  long lVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_type finish;
  size_type loc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  undefined8 local_60;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_10;
  
  local_10 = ::std::__cxx11::string::find_first_of((char)in_RDI,0x7b);
  while (local_10 != -1) {
    lVar1 = ::std::__cxx11::string::find_first_of((char *)in_RDI,0x18ff31);
    if (lVar1 != -1) {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar2 == '}') {
        in_stack_ffffffffffffff60 = in_RDI;
        ::std::__cxx11::string::begin();
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+(in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        ::std::__cxx11::string::begin();
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+(in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+(in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        ::std::__cxx11::string::erase(in_stack_ffffffffffffff60,local_20,local_38);
      }
    }
    local_10 = ::std::__cxx11::string::find_first_of((char)in_RDI,0x7b);
  }
  ::std::__cxx11::string::begin();
  ::std::__cxx11::string::end();
  ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff60,in_RDI);
  ::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff60,in_RDI);
  ::std::__cxx11::string::erase(in_RDI,local_60,in_stack_ffffffffffffff78._M_current);
  return;
}

Assistant:

CLI11_INLINE void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{', 2);
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}